

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_zip_entry_compressionmethod(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  void *pvVar2;
  SyArchiveEntry *pEntry;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  if ((nArg < 1) || (iVar1 = jx9_value_is_resource(*apArg), iVar1 == 0)) {
    jx9_context_throw_error(pCtx,1,"Expecting a ZIP archive entry");
    jx9_result_bool(pCtx,0);
  }
  else {
    pvVar2 = jx9_value_to_resource(*apArg);
    if ((pvVar2 == (void *)0x0) || (*(int *)((long)pvVar2 + 0xa0) != -0x21529ca6)) {
      jx9_context_throw_error(pCtx,1,"Expecting a ZIP archive entry");
      jx9_result_bool(pCtx,0);
    }
    else {
      switch(*(undefined2 *)((long)pvVar2 + 0x4c)) {
      case 0:
        jx9_result_string(pCtx,"stored",6);
        break;
      case 1:
        jx9_result_string(pCtx,"shrunk",6);
        break;
      case 2:
      case 3:
      case 4:
      case 5:
        jx9_result_string(pCtx,"reduced",7);
        break;
      case 6:
        jx9_result_string(pCtx,"implode",7);
        break;
      default:
        jx9_result_string(pCtx,"unknown",7);
        break;
      case 8:
        jx9_result_string(pCtx,"deflate",7);
      }
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_zip_entry_compressionmethod(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	SyArchiveEntry *pEntry;
	if( nArg < 1 || !jx9_value_is_resource(apArg[0]) ){
		/* Missing/Invalid arguments */
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "Expecting a ZIP archive entry");
		/* return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Make sure we are dealing with a valid ZIP archive entry */
	pEntry = (SyArchiveEntry *)jx9_value_to_resource(apArg[0]);
	if( SXARCH_ENTRY_INVALID(pEntry) ){
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "Expecting a ZIP archive entry");
		/* return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	switch(pEntry->nComprMeth){
	case 0:
		/* No compression;entry is stored */
		jx9_result_string(pCtx, "stored", (int)sizeof("stored")-1);
		break;
	case 8:
		/* Entry is deflated (Default compression algorithm)  */
		jx9_result_string(pCtx, "deflate", (int)sizeof("deflate")-1);
		break;
		/* Exotic compression algorithms */ 
	case 1:
		jx9_result_string(pCtx, "shrunk", (int)sizeof("shrunk")-1);
		break;
	case 2:
	case 3:
	case 4:
	case 5:
		/* Entry is reduced */
		jx9_result_string(pCtx, "reduced", (int)sizeof("reduced")-1);
		break;
	case 6:
		/* Entry is imploded */
		jx9_result_string(pCtx, "implode", (int)sizeof("implode")-1);
		break;
	default:
		jx9_result_string(pCtx, "unknown", (int)sizeof("unknown")-1);
		break;
	}
	return JX9_OK;
}